

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void spanExpr(ExprSpan *pOut,Parse *pParse,int op,Token t)

{
  Expr *__s;
  char *__src;
  uint uVar1;
  Expr *p;
  int op_local;
  Parse *pParse_local;
  ExprSpan *pOut_local;
  Token t_local;
  
  __src = t.z;
  uVar1 = t.n;
  __s = (Expr *)sqlite3DbMallocRawNN(pParse->db,(ulong)uVar1 + 0x49);
  if (__s != (Expr *)0x0) {
    memset(__s,0,0x48);
    __s->op = (u8)op;
    __s->flags = 0x800000;
    __s->iAgg = -1;
    (__s->u).zToken = (char *)(__s + 1);
    memcpy((__s->u).zToken,__src,(ulong)uVar1);
    (__s->u).zToken[uVar1] = '\0';
    if ((""[(byte)*(__s->u).zToken] & 0x80) != 0) {
      if (*(__s->u).zToken == '\"') {
        __s->flags = __s->flags | 0x40;
      }
      sqlite3Dequote((__s->u).zToken);
    }
    __s->nHeight = 1;
  }
  pOut->pExpr = __s;
  pOut->zStart = __src;
  pOut->zEnd = __src + uVar1;
  return;
}

Assistant:

static void spanExpr(ExprSpan *pOut, Parse *pParse, int op, Token t){
    Expr *p = sqlite3DbMallocRawNN(pParse->db, sizeof(Expr)+t.n+1);
    if( p ){
      memset(p, 0, sizeof(Expr));
      p->op = (u8)op;
      p->flags = EP_Leaf;
      p->iAgg = -1;
      p->u.zToken = (char*)&p[1];
      memcpy(p->u.zToken, t.z, t.n);
      p->u.zToken[t.n] = 0;
      if( sqlite3Isquote(p->u.zToken[0]) ){
        if( p->u.zToken[0]=='"' ) p->flags |= EP_DblQuoted;
        sqlite3Dequote(p->u.zToken);
      }
#if SQLITE_MAX_EXPR_DEPTH>0
      p->nHeight = 1;
#endif  
    }
    pOut->pExpr = p;
    pOut->zStart = t.z;
    pOut->zEnd = &t.z[t.n];
  }